

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapped_transform.cc
# Opt level: O0

void __thiscall
webrtc::LappedTransform::BlockThunk::ProcessBlock
          (BlockThunk *this,float **input,size_t num_frames,size_t num_input_channels,
          size_t num_output_channels,float **output)

{
  Callback *pCVar1;
  size_t sVar2;
  void *__dest;
  float **ppfVar3;
  size_t sVar4;
  int order;
  float *pfVar5;
  pointer pRVar6;
  complex<float> *pcVar7;
  complex<float> **ppcVar8;
  complex<float> **ppcVar9;
  float **local_660;
  size_t i_1;
  string *local_4e0;
  string *_result_3;
  size_t block_length;
  size_t i;
  string *local_350;
  string *_result_2;
  string *local_1d0;
  string *_result_1;
  FatalMessage local_1b8;
  string *local_40;
  string *_result;
  float **output_local;
  size_t num_output_channels_local;
  size_t num_input_channels_local;
  size_t num_frames_local;
  float **input_local;
  BlockThunk *this_local;
  
  _result = (string *)output;
  output_local = (float **)num_output_channels;
  num_output_channels_local = num_input_channels;
  num_input_channels_local = num_frames;
  num_frames_local = (size_t)input;
  input_local = (float **)this;
  local_40 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&num_output_channels_local,&this->parent_->num_in_channels_,
                        "num_input_channels == parent_->num_in_channels_");
  if (local_40 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
               ,0x1b,local_40);
    rtc::FatalMessage::stream(&local_1b8);
    rtc::FatalMessage::~FatalMessage(&local_1b8);
  }
  local_1d0 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                        ((unsigned_long *)&output_local,&this->parent_->num_out_channels_,
                         "num_output_channels == parent_->num_out_channels_");
  if (local_1d0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&_result_2,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
               ,0x1c,local_1d0);
    rtc::FatalMessage::stream((FatalMessage *)&_result_2);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_2);
  }
  local_350 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                        (&this->parent_->block_length_,&num_input_channels_local,
                         "parent_->block_length_ == num_frames");
  if (local_350 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&i,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
               ,0x1d,local_350);
    rtc::FatalMessage::stream((FatalMessage *)&i);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&i);
  }
  local_350 = (string *)0x0;
  for (block_length = 0; block_length < num_output_channels_local; block_length = block_length + 1)
  {
    pfVar5 = AlignedArray<float>::Row(&this->parent_->real_buf_,block_length);
    memcpy(pfVar5,*(void **)(num_frames_local + block_length * 8),num_input_channels_local << 2);
    pRVar6 = std::unique_ptr<webrtc::RealFourier,_std::default_delete<webrtc::RealFourier>_>::
             operator->(&this->parent_->fft_);
    pfVar5 = AlignedArray<float>::Row(&this->parent_->real_buf_,block_length);
    pcVar7 = AlignedArray<std::complex<float>_>::Row(&this->parent_->cplx_pre_,block_length);
    (*pRVar6->_vptr_RealFourier[2])(pRVar6,pfVar5,pcVar7);
  }
  order = RealFourier::FftOrder(num_input_channels_local);
  _result_3 = (string *)RealFourier::ComplexLength(order);
  local_4e0 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                        (&this->parent_->cplx_length_,(unsigned_long *)&_result_3,
                         "parent_->cplx_length_ == block_length");
  if (local_4e0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&i_1,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/lapped_transform.cc"
               ,0x28,local_4e0);
    rtc::FatalMessage::stream((FatalMessage *)&i_1);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&i_1);
  }
  pCVar1 = this->parent_->block_processor_;
  ppcVar8 = AlignedArray<std::complex<float>_>::Array(&this->parent_->cplx_pre_);
  sVar4 = num_output_channels_local;
  ppfVar3 = output_local;
  sVar2 = this->parent_->cplx_length_;
  ppcVar9 = AlignedArray<std::complex<float>_>::Array(&this->parent_->cplx_post_);
  (*pCVar1->_vptr_Callback[2])(pCVar1,ppcVar8,sVar4,sVar2,ppfVar3,ppcVar9);
  for (local_660 = (float **)0x0; local_660 < output_local;
      local_660 = (float **)((long)local_660 + 1)) {
    pRVar6 = std::unique_ptr<webrtc::RealFourier,_std::default_delete<webrtc::RealFourier>_>::
             operator->(&this->parent_->fft_);
    pcVar7 = AlignedArray<std::complex<float>_>::Row(&this->parent_->cplx_post_,(size_t)local_660);
    pfVar5 = AlignedArray<float>::Row(&this->parent_->real_buf_,(size_t)local_660);
    (*pRVar6->_vptr_RealFourier[3])(pRVar6,pcVar7,pfVar5);
    __dest = *(void **)(_result + (long)local_660 * 8);
    pfVar5 = AlignedArray<float>::Row(&this->parent_->real_buf_,(size_t)local_660);
    memcpy(__dest,pfVar5,num_input_channels_local << 2);
  }
  return;
}

Assistant:

void LappedTransform::BlockThunk::ProcessBlock(const float* const* input,
                                               size_t num_frames,
                                               size_t num_input_channels,
                                               size_t num_output_channels,
                                               float* const* output) {
  RTC_CHECK_EQ(num_input_channels, parent_->num_in_channels_);
  RTC_CHECK_EQ(num_output_channels, parent_->num_out_channels_);
  RTC_CHECK_EQ(parent_->block_length_, num_frames);

  for (size_t i = 0; i < num_input_channels; ++i) {
    memcpy(parent_->real_buf_.Row(i), input[i],
           num_frames * sizeof(*input[0]));
    parent_->fft_->Forward(parent_->real_buf_.Row(i),
                           parent_->cplx_pre_.Row(i));
  }

  size_t block_length = RealFourier::ComplexLength(
      RealFourier::FftOrder(num_frames));
  RTC_CHECK_EQ(parent_->cplx_length_, block_length);
  parent_->block_processor_->ProcessAudioBlock(parent_->cplx_pre_.Array(),
                                               num_input_channels,
                                               parent_->cplx_length_,
                                               num_output_channels,
                                               parent_->cplx_post_.Array());

  for (size_t i = 0; i < num_output_channels; ++i) {
    parent_->fft_->Inverse(parent_->cplx_post_.Row(i),
                           parent_->real_buf_.Row(i));
    memcpy(output[i], parent_->real_buf_.Row(i),
           num_frames * sizeof(*input[0]));
  }
}